

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

int nghttp2_stream_dep_insert_subtree(nghttp2_stream *dep_stream,nghttp2_stream *stream)

{
  int iVar1;
  nghttp2_stream *a;
  nghttp2_stream *pnStack_38;
  int rv;
  nghttp2_stream *si;
  nghttp2_stream *dep_next;
  nghttp2_stream *last_sib;
  nghttp2_stream *stream_local;
  nghttp2_stream *dep_stream_local;
  
  stream->sum_dep_weight = dep_stream->sum_dep_weight + stream->sum_dep_weight;
  dep_stream->sum_dep_weight = stream->weight;
  if (dep_stream->dep_next == (nghttp2_stream *)0x0) {
    link_dep(dep_stream,stream);
  }
  else {
    pnStack_38 = dep_stream->dep_next;
    link_dep(dep_stream,stream);
    if (stream->dep_next == (nghttp2_stream *)0x0) {
      link_dep(stream,pnStack_38);
    }
    else {
      a = stream_last_sib(stream->dep_next);
      link_sib(a,pnStack_38);
    }
    for (; pnStack_38 != (nghttp2_stream *)0x0; pnStack_38 = pnStack_38->sib_next) {
      pnStack_38->dep_prev = stream;
      if ((pnStack_38->queued != '\0') &&
         (iVar1 = stream_obq_move(stream,dep_stream,pnStack_38), iVar1 != 0)) {
        return iVar1;
      }
    }
  }
  iVar1 = stream_subtree_active(stream);
  if ((iVar1 == 0) ||
     (dep_stream_local._4_4_ = stream_obq_push(dep_stream,stream), dep_stream_local._4_4_ == 0)) {
    validate_tree(dep_stream);
    dep_stream_local._4_4_ = 0;
  }
  return dep_stream_local._4_4_;
}

Assistant:

int nghttp2_stream_dep_insert_subtree(nghttp2_stream *dep_stream,
                                      nghttp2_stream *stream) {
  nghttp2_stream *last_sib;
  nghttp2_stream *dep_next;
  nghttp2_stream *si;
  int rv;

  DEBUGF("stream: dep_insert_subtree dep_stream(%p)=%d stream(%p)=%d\n",
         dep_stream, dep_stream->stream_id, stream, stream->stream_id);

  stream->sum_dep_weight += dep_stream->sum_dep_weight;
  dep_stream->sum_dep_weight = stream->weight;

  if (dep_stream->dep_next) {
    dep_next = dep_stream->dep_next;

    link_dep(dep_stream, stream);

    if (stream->dep_next) {
      last_sib = stream_last_sib(stream->dep_next);

      link_sib(last_sib, dep_next);
    } else {
      link_dep(stream, dep_next);
    }

    for (si = dep_next; si; si = si->sib_next) {
      si->dep_prev = stream;
      if (si->queued) {
        rv = stream_obq_move(stream, dep_stream, si);
        if (rv != 0) {
          return rv;
        }
      }
    }
  } else {
    link_dep(dep_stream, stream);
  }

  if (stream_subtree_active(stream)) {
    rv = stream_obq_push(dep_stream, stream);
    if (rv != 0) {
      return rv;
    }
  }

  validate_tree(dep_stream);

  return 0;
}